

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O3

size_t __thiscall
edition_unittest::RepeatedGroup_extension::ByteSizeLong(RepeatedGroup_extension *this)

{
  long lVar1;
  ulong uVar2;
  size_t sVar3;
  
  if ((undefined1  [12])((undefined1  [12])this->field_0 & (undefined1  [12])0x1) ==
      (undefined1  [12])0x0) {
    sVar3 = 0;
  }
  else {
    uVar2 = (long)(this->field_0)._impl_.a_ | 1;
    lVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar3 = (ulong)((int)lVar1 * 9 + 0x49U >> 6) + 2;
  }
  sVar3 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar3,&(this->field_0)._impl_._cached_size_);
  return sVar3;
}

Assistant:

::size_t RepeatedGroup_extension::ByteSizeLong() const {
  const RepeatedGroup_extension& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:edition_unittest.RepeatedGroup_extension)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

   {
    // int32 a = 47;
    cached_has_bits = this_._impl_._has_bits_[0];
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_a());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}